

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppConsole::ClearLog(ExampleAppConsole *this)

{
  char **ppcVar1;
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int i_00;
  
  for (i_00 = 0; i_00 < *(int *)(in_RDI + 0x100); i_00 = i_00 + 1) {
    ppcVar1 = ImVector<char_*>::operator[]((ImVector<char_*> *)(in_RDI + 0x100),i_00);
    free(*ppcVar1);
  }
  ImVector<char_*>::clear((ImVector<char_*> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void    ClearLog()
    {
        for (int i = 0; i < Items.Size; i++)
            free(Items[i]);
        Items.clear();
    }